

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::HelpFlag::Match(HelpFlag *this,string *arg)

{
  FlagBase *pFVar1;
  string *flag;
  string *in_stack_000001b0;
  FlagBase *in_stack_000001b8;
  Help *in_stack_ffffffffffffffe0;
  
  pFVar1 = FlagBase::Match(in_stack_000001b8,in_stack_000001b0);
  if (pFVar1 != (FlagBase *)0x0) {
    flag = (string *)__cxa_allocate_exception(0x10);
    Help::Help(in_stack_ffffffffffffffe0,flag);
    __cxa_throw(flag,&Help::typeinfo,Help::~Help);
  }
  return (FlagBase *)0x0;
}

Assistant:

virtual FlagBase *Match(const std::string &arg) override
            {
                if (FlagBase::Match(arg))
                {
#ifdef ARGS_NOEXCEPT
                    error = Error::Help;
                    return this;
#else
                    throw Help(arg);
#endif
                }
                return nullptr;
            }